

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::scrape_tracker(torrent *this,int idx,bool user_triggered)

{
  bool bVar1;
  size_t sVar2;
  announce_entry *local_20;
  announce_entry *ae;
  bool user_triggered_local;
  int idx_local;
  torrent *this_local;
  
  bVar1 = tracker_list::empty(&this->m_trackers);
  if (!bVar1) {
    if ((idx < 0) || (sVar2 = tracker_list::size(&this->m_trackers), (int)sVar2 <= idx)) {
      local_20 = tracker_list::last_working(&this->m_trackers);
      if (local_20 == (announce_entry *)0x0) {
        local_20 = tracker_list::first(&this->m_trackers);
      }
    }
    else {
      local_20 = tracker_list::find(&this->m_trackers,idx);
    }
    if (local_20 != (announce_entry *)0x0) {
      scrape_tracker_impl(this,local_20,user_triggered);
    }
  }
  return;
}

Assistant:

void torrent::scrape_tracker(int idx, bool const user_triggered)
	{
		TORRENT_ASSERT(is_single_thread());

		if (m_trackers.empty()) return;

		aux::announce_entry* ae = nullptr;
		if (idx < 0 || idx >= int(m_trackers.size()))
		{
			ae = m_trackers.last_working();
			if (ae == nullptr) ae = m_trackers.first();
		}
		else
		{
			ae = m_trackers.find(idx);
		}
		if (ae == nullptr) return;

		scrape_tracker_impl(*ae, user_triggered);
	}